

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::reshapeTest(ViewTest *this)

{
  float fVar1;
  size_t sVar2;
  reference pfVar3;
  reference pfVar4;
  float local_1fc;
  runtime_error *anon_var_0;
  undefined1 local_1e8 [8];
  View<float,_false,_std::allocator<unsigned_long>_> x;
  size_t newShape_1 [2];
  size_t shape_1 [3];
  unsigned_long uStack_178;
  size_t base [3];
  size_t local_158;
  size_t j_1;
  unsigned_long uStack_148;
  size_t newShape [2];
  undefined1 local_130 [8];
  View<float,_false,_std::allocator<unsigned_long>_> w;
  allocator<float> local_d9;
  undefined1 local_d8 [8];
  View<float,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  size_t j;
  float data [24];
  ViewTest *this_local;
  
  for (shape[2] = 0; shape[2] < 0x18; shape[2] = shape[2] + 1) {
    local_1fc = (float)shape[2];
    data[shape[2] - 2] = local_1fc;
  }
  v.geometry_.coordinateOrder_ = 2;
  v.geometry_.isSimple_ = false;
  v.geometry_._53_3_ = 0;
  shape[0] = 4;
  shape[1] = 3;
  std::allocator<float>::allocator(&local_d9);
  andres::View<float,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)local_d8,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,(pointer)&j,
             &andres::defaultOrder,&andres::defaultOrder,&local_d9);
  std::allocator<float>::~allocator(&local_d9);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_130,
             (View<float,_false,_std::allocator<unsigned_long>_> *)local_d8);
  uStack_148 = 4;
  newShape[0] = 6;
  andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)local_d8,&uStack_148,newShape + 1);
  sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8);
  j_1._7_1_ = sVar2 == 2;
  test((bool *)((long)&j_1 + 7));
  sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::size
                    ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8);
  j_1._6_1_ = sVar2 == 0x18;
  test((bool *)((long)&j_1 + 6));
  sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8,0);
  j_1._5_1_ = sVar2 == 4;
  test((bool *)((long)&j_1 + 5));
  sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8,1);
  j_1._4_1_ = sVar2 == 6;
  test((bool *)((long)&j_1 + 4));
  j_1._3_1_ = andres::View<float,_false,_std::allocator<unsigned_long>_>::isSimple
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8);
  test((bool *)((long)&j_1 + 3));
  pfVar3 = andres::View<float,false,std::allocator<unsigned_long>>::operator()
                     ((View<float,false,std::allocator<unsigned_long>> *)local_d8,0);
  pfVar4 = andres::View<float,false,std::allocator<unsigned_long>>::operator()
                     ((View<float,false,std::allocator<unsigned_long>> *)local_130,0);
  j_1._2_1_ = pfVar3 == pfVar4;
  test((bool *)((long)&j_1 + 2));
  for (local_158 = 0;
      sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::size
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8),
      local_158 < sVar2; local_158 = local_158 + 1) {
    pfVar3 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8,local_158);
    fVar1 = *pfVar3;
    pfVar3 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<float,_false,_std::allocator<unsigned_long>_> *)local_130,local_158);
    base[2]._7_1_ = fVar1 == *pfVar3;
    test((bool *)((long)base + 0x17));
  }
  uStack_178 = 0;
  base[0] = 1;
  base[1] = 1;
  newShape_1[1] = 2;
  x.geometry_.coordinateOrder_ = 3;
  x.geometry_.isSimple_ = false;
  x.geometry_._53_3_ = 0;
  newShape_1[0] = 4;
  andres::View<float,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1e8,
             (View<float,false,std::allocator<unsigned_long>> *)local_d8,&uStack_178,newShape_1 + 1)
  ;
  andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)local_1e8,
             (unsigned_long *)&x.geometry_.coordinateOrder_,newShape_1 + 1);
  anon_var_0._7_1_ = 0;
  test((bool *)((long)&anon_var_0 + 7));
  andres::View<float,_false,_std::allocator<unsigned_long>_>::~View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1e8);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::~View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_130);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::~View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_d8);
  return;
}

Assistant:

void ViewTest::reshapeTest()
{
    float data[24];
    for(std::size_t j=0; j<24; ++j) {
        data[j] = static_cast<float>(j);
    }
    std::size_t shape[] = {2, 4, 3};
    andres::View<float, false> v(&shape[0], &shape[3], data);
    andres::View<float, false> w = v; // copy
    
    std::size_t newShape[] = {4, 6};
    v.reshape(&newShape[0], &newShape[2]);

    test(v.dimension() == 2);
    test(v.size() == 24);
    test(v.shape(0) == 4);
    test(v.shape(1) == 6);
    test(v.isSimple());
    test(&v(0) == &w(0));
    for(std::size_t j=0; j<v.size(); ++j) {
        test(v(j) == w(j));
    }

    if(!andres::MARRAY_NO_DEBUG) {
        // negative test
        std::size_t base[] = {0, 1, 1};
        std::size_t shape[] = {2, 3, 2};
        std::size_t newShape[] = {3, 4};
        andres::View<float, false> x = v.view(base, shape);
        try {
            x.reshape(&newShape[0], &newShape[2]);
            test(0 == 1); // reshape should have thrown runtime_error
        }
        catch(std::runtime_error&) {}
    }
}